

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct_x86::forward_int8_x86
          (InnerProduct_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  float fVar2;
  ulong uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar7;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined1 uVar13;
  undefined1 uVar15;
  undefined1 uVar17;
  _func_int **pp_Var18;
  void *pvVar19;
  Layer *pLVar20;
  undefined4 uVar21;
  undefined1 uVar22;
  undefined1 uVar24;
  undefined1 uVar26;
  undefined1 uVar28;
  undefined4 uVar29;
  undefined1 uVar30;
  undefined1 uVar32;
  undefined1 uVar34;
  undefined1 uVar36;
  undefined8 uVar37;
  undefined1 auVar44 [14];
  undefined1 auVar45 [12];
  unkbyte10 Var46;
  undefined1 auVar47 [12];
  int iVar48;
  size_t sVar49;
  int iVar50;
  byte bVar51;
  long lVar52;
  long lVar53;
  _func_int *p_Var54;
  long lVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  char cVar75;
  char cVar76;
  char cVar77;
  char cVar78;
  char cVar79;
  char cVar80;
  undefined1 auVar67 [16];
  short sVar81;
  short sVar85;
  int iVar82;
  short sVar86;
  Mat bottom_blob_int8;
  Option opt_unpack;
  Mat top_blob_int32;
  Mat scale_data;
  undefined7 uVar6;
  undefined6 uVar8;
  undefined5 uVar10;
  undefined4 uVar12;
  undefined3 uVar14;
  undefined2 uVar16;
  undefined4 uVar23;
  undefined3 uVar25;
  undefined2 uVar27;
  undefined4 uVar31;
  undefined3 uVar33;
  undefined2 uVar35;
  undefined1 uVar38;
  undefined1 uVar39;
  undefined3 uVar40;
  undefined1 uVar41;
  undefined2 uVar42;
  undefined1 uVar43;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar83 [12];
  undefined1 auVar84 [16];
  
  iVar56 = *(int *)(this->_vptr_InnerProduct_x86[-3] + 0x30 + (long)&(this->weight_data_int8).data)
           / *(int *)(this->_vptr_InnerProduct_x86[-3] + 0x28 + (long)&(this->weight_data_int8).data
                     );
  if ((bottom_blob->dims == 2) && (bottom_blob->w == iVar56)) {
    iVar50 = bottom_blob->elempack;
    if (1 < bottom_blob->h * iVar50) {
      bottom_blob_int8.cstep = 0;
      bottom_blob_int8.data = (void *)0x0;
      bottom_blob_int8.refcount._0_4_ = 0;
      bottom_blob_int8.refcount._4_4_ = 0;
      bottom_blob_int8.elemsize._0_4_ = 0;
      bottom_blob_int8.elemsize._4_4_ = 0;
      bottom_blob_int8.elempack = 0;
      bottom_blob_int8.allocator = (Allocator *)0x0;
      bottom_blob_int8.dims = 0;
      bottom_blob_int8.w = 0;
      bottom_blob_int8.h = 0;
      bottom_blob_int8.d = 0;
      bottom_blob_int8.c = 0;
      opt_unpack.lightmode = opt->lightmode;
      opt_unpack._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_unpack.num_threads = opt->num_threads;
      opt_unpack.workspace_allocator = opt->workspace_allocator;
      opt_unpack.openmp_blocktime = opt->openmp_blocktime;
      opt_unpack.use_winograd_convolution = opt->use_winograd_convolution;
      opt_unpack.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_unpack.use_int8_inference = opt->use_int8_inference;
      opt_unpack.use_vulkan_compute = opt->use_vulkan_compute;
      opt_unpack.use_bf16_storage = opt->use_bf16_storage;
      opt_unpack.use_fp16_packed = opt->use_fp16_packed;
      opt_unpack.use_fp16_storage = opt->use_fp16_storage;
      opt_unpack.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_unpack.use_int8_packed = opt->use_int8_packed;
      opt_unpack.use_int8_storage = opt->use_int8_storage;
      opt_unpack.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_unpack.use_packing_layout = opt->use_packing_layout;
      opt_unpack.use_shader_pack8 = opt->use_shader_pack8;
      opt_unpack.use_subgroup_basic = opt->use_subgroup_basic;
      opt_unpack.use_subgroup_vote = opt->use_subgroup_vote;
      opt_unpack.use_subgroup_ballot = opt->use_subgroup_ballot;
      opt_unpack.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      opt_unpack.use_image_storage = opt->use_image_storage;
      opt_unpack.use_tensor_storage = opt->use_tensor_storage;
      opt_unpack.use_weight_fp16_storage = opt->use_weight_fp16_storage;
      opt_unpack.flush_denormals = opt->flush_denormals;
      opt_unpack.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_unpack.use_reserved_1 = opt->use_reserved_1;
      opt_unpack.use_reserved_2 = opt->use_reserved_2;
      opt_unpack.use_reserved_3 = opt->use_reserved_3;
      opt_unpack.use_reserved_4 = opt->use_reserved_4;
      opt_unpack.use_reserved_5 = opt->use_reserved_5;
      opt_unpack.use_reserved_6 = opt->use_reserved_6;
      opt_unpack.use_reserved_7 = opt->use_reserved_7;
      opt_unpack.use_reserved_8 = opt->use_reserved_8;
      opt_unpack.use_reserved_9 = opt->use_reserved_9;
      opt_unpack.use_reserved_10 = opt->use_reserved_10;
      opt_unpack.use_reserved_11 = opt->use_reserved_11;
      opt_unpack.blob_allocator = opt->workspace_allocator;
      convert_packing(bottom_blob,&bottom_blob_int8,1,&opt_unpack);
      iVar50 = InnerProduct::forward_int8
                         ((InnerProduct *)
                          ((long)&this->_vptr_InnerProduct_x86 +
                          (long)this->_vptr_InnerProduct_x86[-3]),&bottom_blob_int8,top_blob,opt);
      goto LAB_001bbca0;
    }
  }
  else {
    iVar50 = bottom_blob->elempack;
  }
  if (iVar50 == 0) {
    Mat::Mat(&bottom_blob_int8,bottom_blob);
LAB_001bb897:
    opt_unpack.lightmode = opt->lightmode;
    opt_unpack._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_unpack.num_threads = opt->num_threads;
    opt_unpack.workspace_allocator = opt->workspace_allocator;
    opt_unpack.openmp_blocktime = opt->openmp_blocktime;
    opt_unpack.use_winograd_convolution = opt->use_winograd_convolution;
    opt_unpack.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_unpack.use_int8_inference = opt->use_int8_inference;
    opt_unpack.use_vulkan_compute = opt->use_vulkan_compute;
    opt_unpack.use_bf16_storage = opt->use_bf16_storage;
    opt_unpack.use_fp16_packed = opt->use_fp16_packed;
    opt_unpack.use_fp16_storage = opt->use_fp16_storage;
    opt_unpack.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_unpack.use_int8_packed = opt->use_int8_packed;
    opt_unpack.use_int8_storage = opt->use_int8_storage;
    opt_unpack.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_unpack.use_packing_layout = opt->use_packing_layout;
    opt_unpack.use_shader_pack8 = opt->use_shader_pack8;
    opt_unpack.use_subgroup_basic = opt->use_subgroup_basic;
    opt_unpack.use_subgroup_vote = opt->use_subgroup_vote;
    opt_unpack.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_unpack.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_unpack.use_image_storage = opt->use_image_storage;
    opt_unpack.use_tensor_storage = opt->use_tensor_storage;
    opt_unpack.use_weight_fp16_storage = opt->use_weight_fp16_storage;
    opt_unpack.flush_denormals = opt->flush_denormals;
    opt_unpack.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_unpack.use_reserved_1 = opt->use_reserved_1;
    opt_unpack.use_reserved_2 = opt->use_reserved_2;
    opt_unpack.use_reserved_3 = opt->use_reserved_3;
    opt_unpack.use_reserved_4 = opt->use_reserved_4;
    opt_unpack.use_reserved_5 = opt->use_reserved_5;
    opt_unpack.use_reserved_6 = opt->use_reserved_6;
    opt_unpack.use_reserved_7 = opt->use_reserved_7;
    opt_unpack.use_reserved_8 = opt->use_reserved_8;
    opt_unpack.use_reserved_9 = opt->use_reserved_9;
    opt_unpack.use_reserved_10 = opt->use_reserved_10;
    opt_unpack.use_reserved_11 = opt->use_reserved_11;
    opt_unpack.blob_allocator = opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&bottom_blob_int8,
                     (Mat *)(&this->field_0x208 + (long)this->_vptr_InnerProduct_x86[-3]),
                     &opt_unpack);
  }
  else {
    sVar49 = bottom_blob->elemsize;
    Mat::Mat(&bottom_blob_int8,bottom_blob);
    if (((int)sVar49 << 3) / iVar50 != 8) goto LAB_001bb897;
  }
  opt_unpack.blob_allocator =
       (Allocator *)CONCAT44(bottom_blob_int8.refcount._4_4_,bottom_blob_int8.refcount._0_4_);
  opt_unpack._0_8_ = bottom_blob_int8.data;
  opt_unpack.workspace_allocator =
       (Allocator *)CONCAT44(bottom_blob_int8.elemsize._4_4_,(undefined4)bottom_blob_int8.elemsize);
  opt_unpack.openmp_blocktime = bottom_blob_int8.elempack;
  opt_unpack.use_subgroup_shuffle = (bool)(undefined1)bottom_blob_int8.w;
  opt_unpack.use_image_storage = (bool)bottom_blob_int8.w._1_1_;
  opt_unpack.use_tensor_storage = (bool)bottom_blob_int8.w._2_1_;
  opt_unpack.use_weight_fp16_storage = (bool)bottom_blob_int8.w._3_1_;
  opt_unpack.use_shader_pack8 = (bool)(undefined1)bottom_blob_int8.dims;
  opt_unpack.use_subgroup_basic = (bool)bottom_blob_int8.dims._1_1_;
  opt_unpack.use_subgroup_vote = (bool)bottom_blob_int8.dims._2_1_;
  opt_unpack.use_subgroup_ballot = (bool)bottom_blob_int8.dims._3_1_;
  opt_unpack._52_4_ = bottom_blob_int8.d;
  opt_unpack.flush_denormals = bottom_blob_int8.h;
  opt_unpack._32_8_ = bottom_blob_int8.allocator;
  opt_unpack.use_reserved_4 = (bool)(undefined1)bottom_blob_int8.c;
  opt_unpack.use_reserved_5 = (bool)bottom_blob_int8.c._1_1_;
  opt_unpack.use_reserved_6 = (bool)bottom_blob_int8.c._2_1_;
  opt_unpack.use_reserved_7 = (bool)bottom_blob_int8.c._3_1_;
  if (opt_unpack.blob_allocator != (Allocator *)0x0) {
    LOCK();
    *(int *)&(opt_unpack.blob_allocator)->_vptr_Allocator =
         *(int *)&(opt_unpack.blob_allocator)->_vptr_Allocator + 1;
    UNLOCK();
  }
  if (bottom_blob_int8.dims != 1) {
    top_blob_int32.data = *(void **)opt;
    uVar21 = opt->openmp_blocktime;
    uVar22 = opt->use_winograd_convolution;
    uVar24 = opt->use_sgemm_convolution;
    uVar26 = opt->use_int8_inference;
    uVar28 = opt->use_vulkan_compute;
    uVar27 = CONCAT11(uVar28,uVar26);
    uVar25 = CONCAT21(uVar27,uVar24);
    uVar23 = CONCAT31(uVar25,uVar22);
    auVar65[0] = opt->use_bf16_storage;
    auVar65[1] = opt->use_fp16_packed;
    auVar65[2] = opt->use_fp16_storage;
    auVar65[3] = opt->use_fp16_arithmetic;
    auVar65[4] = opt->use_int8_packed;
    auVar65[5] = opt->use_int8_storage;
    auVar65[6] = opt->use_int8_arithmetic;
    auVar65[7] = opt->use_packing_layout;
    uVar4 = opt->use_shader_pack8;
    uVar5 = opt->use_subgroup_basic;
    uVar7 = opt->use_subgroup_vote;
    uVar9 = opt->use_subgroup_ballot;
    uVar11 = opt->use_subgroup_shuffle;
    uVar13 = opt->use_image_storage;
    uVar15 = opt->use_tensor_storage;
    uVar17 = opt->use_weight_fp16_storage;
    uVar16 = CONCAT11(uVar17,uVar15);
    uVar14 = CONCAT21(uVar16,uVar13);
    uVar12 = CONCAT31(uVar14,uVar11);
    uVar10 = CONCAT41(uVar12,uVar9);
    uVar8 = CONCAT51(uVar10,uVar7);
    uVar6 = CONCAT61(uVar8,uVar5);
    auVar65._8_8_ = CONCAT71(uVar6,uVar4);
    uVar29 = opt->flush_denormals;
    uVar30 = opt->use_local_pool_allocator;
    uVar32 = opt->use_reserved_1;
    uVar34 = opt->use_reserved_2;
    uVar36 = opt->use_reserved_3;
    uVar35 = CONCAT11(uVar36,uVar34);
    uVar33 = CONCAT21(uVar35,uVar32);
    uVar31 = CONCAT31(uVar33,uVar30);
    uVar37._0_1_ = opt->use_reserved_4;
    uVar37._1_1_ = opt->use_reserved_5;
    uVar37._2_1_ = opt->use_reserved_6;
    uVar37._3_1_ = opt->use_reserved_7;
    uVar38 = opt->use_reserved_8;
    uVar39 = opt->use_reserved_9;
    uVar41 = opt->use_reserved_10;
    uVar43 = opt->use_reserved_11;
    uVar42 = CONCAT11(uVar43,uVar41);
    uVar40 = CONCAT21(uVar42,uVar39);
    uVar37._4_4_ = CONCAT31(uVar40,uVar38);
    top_blob_int32.c = (int)uVar37;
    top_blob_int32.allocator = auVar65._0_8_;
    top_blob_int32.dims = (int)auVar65._8_8_;
    top_blob_int32.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
    top_blob_int32.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    top_blob_int32.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    top_blob_int32.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    top_blob_int32.elempack = uVar21;
    top_blob_int32._28_4_ = uVar23;
    top_blob_int32.w = uVar12;
    top_blob_int32.h = uVar29;
    top_blob_int32.d = uVar31;
    top_blob_int32._60_4_ = uVar37._4_4_;
    (*this->flatten->_vptr_Layer[7])(this->flatten,&bottom_blob_int8,&opt_unpack);
  }
  bVar51 = (*(uint *)(this->_vptr_InnerProduct_x86[-3] + 0x28 + (long)&(this->weight_data_int8).data
                     ) & 7) == 0 & opt->use_packing_layout;
  iVar57 = 1;
  if (bVar51 != 0) {
    iVar57 = 8;
  }
  Mat::create(top_blob,(int)*(uint *)(this->_vptr_InnerProduct_x86[-3] + 0x28 +
                                     (long)&(this->weight_data_int8).data) / iVar57,
              (ulong)(uint)(iVar57 * 4),iVar57,opt->blob_allocator);
  iVar50 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    top_blob_int32.cstep = 0;
    top_blob_int32.data = (void *)0x0;
    top_blob_int32.refcount._0_4_ = 0;
    top_blob_int32.refcount._4_4_ = 0;
    top_blob_int32.elemsize._0_4_ = 0;
    top_blob_int32.elemsize._4_4_ = 0;
    top_blob_int32.elempack = 0;
    top_blob_int32.allocator = (Allocator *)0x0;
    top_blob_int32.dims = 0;
    top_blob_int32.w = 0;
    top_blob_int32.h = 0;
    top_blob_int32.d = 0;
    top_blob_int32.c = 0;
    Mat::create(&top_blob_int32,
                *(int *)(this->_vptr_InnerProduct_x86[-3] + 0x28 +
                        (long)&(this->weight_data_int8).data) / iVar57,(ulong)(uint)(iVar57 * 4),
                iVar57,opt->workspace_allocator);
    iVar50 = -100;
    if ((top_blob_int32.data != (void *)0x0) && ((long)top_blob_int32.c * top_blob_int32.cstep != 0)
       ) {
      pp_Var18 = this->_vptr_InnerProduct_x86;
      if (bVar51 == 0) {
        pvVar19 = (this->weight_data_int8).data;
        sVar49 = (this->weight_data_int8).elemsize;
        lVar52 = 0;
        if (iVar56 < 1) {
          iVar56 = 0;
        }
        for (lVar53 = 0; p_Var54 = pp_Var18[-3],
            lVar53 < *(int *)(p_Var54 + 0x28 + (long)&(this->weight_data_int8).data);
            lVar53 = lVar53 + 1) {
          iVar50 = 0;
          for (lVar55 = 0; iVar56 != (int)lVar55; lVar55 = lVar55 + 1) {
            iVar50 = iVar50 + (int)*(char *)((long)pvVar19 +
                                            lVar55 + (this->weight_data_int8).w * lVar52) *
                              (int)*(char *)(opt_unpack._0_8_ + lVar55);
          }
          *(int *)((long)top_blob_int32.data + lVar53 * 4) = iVar50;
          lVar52 = lVar52 + sVar49;
        }
      }
      else {
        lVar52 = 0;
        if (iVar56 < 1) {
          iVar56 = 0;
        }
        for (; p_Var54 = pp_Var18[-3],
            lVar52 < *(int *)(p_Var54 + 0x28 + (long)&(this->weight_data_int8).data) / 8;
            lVar52 = lVar52 + 1) {
          iVar50 = 0;
          iVar57 = 0;
          iVar58 = 0;
          iVar59 = 0;
          iVar60 = 0;
          iVar61 = 0;
          iVar62 = 0;
          iVar63 = 0;
          for (lVar53 = 0; iVar56 != (int)lVar53; lVar53 = lVar53 + 1) {
            auVar65 = pshuflw(ZEXT416((uint)(int)*(char *)(opt_unpack._0_8_ + lVar53)),
                              ZEXT416((uint)(int)*(char *)(opt_unpack._0_8_ + lVar53)),0);
            auVar66._0_4_ = auVar65._0_4_;
            auVar66._4_4_ = auVar66._0_4_;
            auVar66._8_4_ = auVar66._0_4_;
            auVar66._12_4_ = auVar66._0_4_;
            uVar3 = *(ulong *)((long)(this->weight_data_int8).data +
                              lVar53 * 8 +
                              (this->weight_data_int8).elemsize * lVar52 *
                              (long)(this->weight_data_int8).w);
            cVar75 = (char)(uVar3 >> 8);
            cVar76 = (char)(uVar3 >> 0x10);
            cVar77 = (char)(uVar3 >> 0x18);
            cVar78 = (char)(uVar3 >> 0x20);
            cVar79 = (char)(uVar3 >> 0x28);
            cVar80 = (char)(uVar3 >> 0x30);
            auVar74._8_6_ = 0;
            auVar74._0_8_ = uVar3;
            auVar74[0xe] = (char)(uVar3 >> 0x38);
            auVar74[0xf] = -((long)uVar3 < 0);
            auVar73._14_2_ = auVar74._14_2_;
            auVar73._8_5_ = 0;
            auVar73._0_8_ = uVar3;
            auVar73[0xd] = -(cVar80 < '\0');
            auVar72._13_3_ = auVar73._13_3_;
            auVar72._8_4_ = 0;
            auVar72._0_8_ = uVar3;
            auVar72[0xc] = cVar80;
            auVar71._12_4_ = auVar72._12_4_;
            auVar71._8_3_ = 0;
            auVar71._0_8_ = uVar3;
            auVar71[0xb] = -(cVar79 < '\0');
            auVar70._11_5_ = auVar71._11_5_;
            auVar70._8_2_ = 0;
            auVar70._0_8_ = uVar3;
            auVar70[10] = cVar79;
            auVar69._10_6_ = auVar70._10_6_;
            auVar69[8] = 0;
            auVar69._0_8_ = uVar3;
            auVar69[9] = -(cVar78 < '\0');
            auVar68._9_7_ = auVar69._9_7_;
            auVar68[8] = cVar78;
            auVar68._0_8_ = uVar3;
            Var46 = CONCAT91(CONCAT81(auVar68._8_8_,-(cVar77 < '\0')),cVar77);
            auVar45._2_10_ = Var46;
            auVar45[1] = -(cVar76 < '\0');
            auVar45[0] = cVar76;
            auVar44._2_12_ = auVar45;
            auVar44[1] = -(cVar75 < '\0');
            auVar44[0] = cVar75;
            auVar67._0_2_ = CONCAT11(-((char)uVar3 < '\0'),(char)uVar3);
            auVar67._2_14_ = auVar44;
            sVar81 = auVar65._0_2_;
            sVar85 = auVar65._2_2_;
            sVar86 = sVar85 * (short)Var46;
            auVar65 = pmulhw(auVar67,auVar66);
            iVar48 = CONCAT22(auVar65._6_2_,sVar86);
            Var46 = CONCAT64(CONCAT42(iVar48,auVar65._4_2_),CONCAT22(sVar81 * auVar45._0_2_,sVar86))
            ;
            auVar47._4_8_ = (long)((unkuint10)Var46 >> 0x10);
            auVar47._2_2_ = auVar65._2_2_;
            auVar47._0_2_ = sVar85 * auVar44._0_2_;
            iVar82 = CONCAT22(auVar65._8_2_,sVar81 * auVar68._8_2_);
            auVar83._0_8_ = CONCAT26(auVar65._10_2_,CONCAT24(sVar85 * auVar70._10_2_,iVar82));
            auVar83._8_2_ = sVar81 * auVar72._12_2_;
            auVar83._10_2_ = auVar65._12_2_;
            auVar84._12_2_ = sVar85 * auVar73._14_2_;
            auVar84._0_12_ = auVar83;
            auVar84._14_2_ = auVar65._14_2_;
            iVar60 = iVar60 + CONCAT22(auVar65._0_2_,sVar81 * auVar67._0_2_);
            iVar61 = iVar61 + auVar47._0_4_;
            iVar62 = iVar62 + (int)((unkuint10)Var46 >> 0x10);
            iVar63 = iVar63 + iVar48;
            iVar50 = iVar50 + iVar82;
            iVar57 = iVar57 + (int)((ulong)auVar83._0_8_ >> 0x20);
            iVar58 = iVar58 + auVar83._8_4_;
            iVar59 = iVar59 + auVar84._12_4_;
          }
          piVar1 = (int *)((long)top_blob_int32.data + lVar52 * 0x20);
          *piVar1 = iVar60;
          piVar1[1] = iVar61;
          piVar1[2] = iVar62;
          piVar1[3] = iVar63;
          piVar1 = (int *)((long)top_blob_int32.data + lVar52 * 0x20 + 0x10);
          *piVar1 = iVar50;
          piVar1[1] = iVar57;
          piVar1[2] = iVar58;
          piVar1[3] = iVar59;
        }
      }
      Mat::Mat(&scale_data,*(int *)(p_Var54 + 0x28 + (long)&(this->weight_data_int8).data),4,
               (Allocator *)0x0);
      pp_Var18 = this->_vptr_InnerProduct_x86;
      for (lVar52 = 0; p_Var54 = pp_Var18[-3],
          lVar52 < *(int *)(p_Var54 + 0x28 + (long)&(this->weight_data_int8).data);
          lVar52 = lVar52 + 1) {
        fVar2 = *(float *)(*(long *)(&this->field_0x1c0 + (long)p_Var54) + lVar52 * 4);
        fVar64 = 0.0;
        if (fVar2 != 0.0) {
          fVar64 = 1.0 / (fVar2 * **(float **)(&this->field_0x208 + (long)p_Var54));
        }
        *(float *)((long)scale_data.data + lVar52 * 4) = fVar64;
      }
      dequantize_from_int32
                (&top_blob_int32,top_blob,&scale_data,(Mat *)(&this->field_0x178 + (long)p_Var54),
                 opt);
      pLVar20 = this->activation;
      if (pLVar20 != (Layer *)0x0) {
        (*pLVar20->_vptr_Layer[9])(pLVar20,top_blob,opt);
      }
      Mat::~Mat(&scale_data);
      iVar50 = 0;
    }
    Mat::~Mat(&top_blob_int32);
  }
  Mat::~Mat((Mat *)&opt_unpack);
LAB_001bbca0:
  Mat::~Mat(&bottom_blob_int8);
  return iVar50;
}

Assistant:

int InnerProduct_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input && bottom_blob.h * bottom_blob.elempack > 1)
    {
        // gemm
        Mat bottom_blob_unpacked;
        Option opt_unpack = opt;
        opt_unpack.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_unpack);

        return forward_int8(bottom_blob_unpacked, top_blob, opt);
    }

    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
    }

    Mat bottom_blob_int8_flattened = bottom_blob_int8;
    if (bottom_blob_int8.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;
        flatten->forward(bottom_blob_int8, bottom_blob_int8_flattened, opt_flatten);
    }

    //     int elempack = bottom_blob_int8_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 8 == 0 ? 8 : 1;
    }
#endif // __SSE2__
    //     size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, (size_t)(4u * out_elempack), out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    Mat top_blob_int32;
    top_blob_int32.create(num_output / out_elempack, (size_t)(4u * out_elempack), out_elempack, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

#if __SSE2__
    if (out_elempack == 8)
    {
// num_output
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < num_output / out_elempack; p++)
        {
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();

            const signed char* kptr = weight_data_int8.row<const signed char>(p);
            const signed char* sptr = bottom_blob_int8_flattened;

            int i = 0;
            for (; i < num_input; i++)
            {
                __m128i _val = _mm_set1_epi16((short)sptr[0]);

                // TODO use _mm_cvtepi8_epi16 on sse4.1
                __m128i _w = _mm_loadl_epi64((const __m128i*)kptr);
                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                __m128i _sl = _mm_mullo_epi16(_val, _w);
                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                _sum0 = _mm_add_epi32(_sum0, _s0);
                _sum1 = _mm_add_epi32(_sum1, _s1);

                sptr += 1;
                kptr += 8;
            }

            int* outptr = (int*)top_blob_int32;
            _mm_storeu_si128((__m128i*)(outptr + p * 8), _sum0);
            _mm_storeu_si128((__m128i*)(outptr + p * 8 + 4), _sum1);
        }
    }
#endif // __SSE2__

    if (out_elempack == 1)
    {
// num_output
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < num_output / out_elempack; p++)
        {
            int sum = 0;

            const signed char* kptr = weight_data_int8.row<const signed char>(p);
            const signed char* sptr = bottom_blob_int8_flattened;

            int i = 0;
            for (; i < num_input; i++)
            {
                signed char val = sptr[0];

                signed char w = kptr[0];

                sum += val * w;

                sptr += 1;
                kptr += 1;
            }

            int* outptr = (int*)top_blob_int32;
            outptr[p] = sum;
        }
    }

    Mat scale_data(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // dequantize
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_data[p] = scale_in;
    }

    dequantize_from_int32(top_blob_int32, top_blob, scale_data, bias_data, opt);

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}